

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZX8081.cpp
# Opt level: O2

shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __thiscall
Storage::Tape::ZX8081::Parser::get_next_file_data
          (Parser *this,shared_ptr<Storage::Tape::Tape> *tape)

{
  int iVar1;
  SymbolType SVar2;
  shared_ptr<Storage::Tape::Tape> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> sVar4;
  uchar local_29;
  
  iVar1 = (**((in_RDX->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
             ->_vptr_Tape)();
  if (((char)iVar1 == '\0') ||
     (_Var3._M_pi = extraout_RDX,
     ((ulong)tape[1].super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_ptr & 1)
     != 0)) {
    SVar2 = Parser<Storage::Tape::ZX8081::SymbolType>::get_next_symbol
                      ((Parser<Storage::Tape::ZX8081::SymbolType> *)tape,in_RDX);
    _Var3._M_pi = extraout_RDX_00;
    if (SVar2 == FileGap) {
      SVar2 = FileGap;
      while ((SVar2 & ~Zero) == FileGap) {
        iVar1 = (**((in_RDX->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->_vptr_Tape)();
        if (((char)iVar1 != '\0') &&
           (((ulong)tape[1].super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr & 1) == 0)) break;
        SVar2 = Parser<Storage::Tape::ZX8081::SymbolType>::get_next_symbol
                          ((Parser<Storage::Tape::ZX8081::SymbolType> *)tape,in_RDX);
      }
      iVar1 = (**((in_RDX->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->_vptr_Tape)();
      if (((char)iVar1 == '\0') ||
         (_Var3._M_pi = extraout_RDX_01,
         ((ulong)tape[1].super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         & 1) != 0)) {
        Parser<Storage::Tape::ZX8081::SymbolType>::return_symbol
                  ((Parser<Storage::Tape::ZX8081::SymbolType> *)tape,SVar2);
        std::make_shared<std::vector<unsigned_char,std::allocator<unsigned_char>>>();
        while( true ) {
          iVar1 = (**((in_RDX->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->_vptr_Tape)();
          if (((char)iVar1 != '\0') &&
             (_Var3._M_pi = extraout_RDX_02,
             ((ulong)tape[1].super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr & 1) == 0)) break;
          iVar1 = get_next_byte((Parser *)tape,in_RDX);
          _Var3._M_pi = extraout_RDX_03;
          if (iVar1 == -1) break;
          local_29 = (uchar)iVar1;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     (this->
                     super_PulseClassificationParser<Storage::Tape::ZX8081::WaveType,_Storage::Tape::ZX8081::SymbolType>
                     ).super_Parser<Storage::Tape::ZX8081::SymbolType>._vptr_Parser,&local_29);
        }
        goto LAB_003f0f68;
      }
    }
  }
  (this->
  super_PulseClassificationParser<Storage::Tape::ZX8081::WaveType,_Storage::Tape::ZX8081::SymbolType>
  ).super_Parser<Storage::Tape::ZX8081::SymbolType>._vptr_Parser = (_func_int **)0x0;
  (this->
  super_PulseClassificationParser<Storage::Tape::ZX8081::WaveType,_Storage::Tape::ZX8081::SymbolType>
  ).super_Parser<Storage::Tape::ZX8081::SymbolType>.error_flag_ = false;
  *(undefined3 *)
   &(this->
    super_PulseClassificationParser<Storage::Tape::ZX8081::WaveType,_Storage::Tape::ZX8081::SymbolType>
    ).super_Parser<Storage::Tape::ZX8081::SymbolType>.field_0x9 = 0;
  (this->
  super_PulseClassificationParser<Storage::Tape::ZX8081::WaveType,_Storage::Tape::ZX8081::SymbolType>
  ).super_Parser<Storage::Tape::ZX8081::SymbolType>.next_symbol_ = One;
LAB_003f0f68:
  sVar4.
  super___shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var3._M_pi;
  sVar4.
  super___shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
         sVar4.
         super___shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<std::vector<uint8_t>> Parser::get_next_file_data(const std::shared_ptr<Storage::Tape::Tape> &tape) {
	if(is_at_end(tape)) return nullptr;
	SymbolType symbol = get_next_symbol(tape);
	if(symbol != SymbolType::FileGap) {
		return nullptr;
	}
	while((symbol == SymbolType::FileGap || symbol == SymbolType::Unrecognised) && !is_at_end(tape)) {
		symbol = get_next_symbol(tape);
	}
	if(is_at_end(tape)) return nullptr;
	return_symbol(symbol);

	auto result = std::make_shared<std::vector<uint8_t>>();
	int byte;
	while(!is_at_end(tape)) {
		byte = get_next_byte(tape);
		if(byte == -1) return result;
		result->push_back(uint8_t(byte));
	}
	return result;
}